

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O3

void __thiscall Money::Money(Money *this,double money,string *currency)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *extraout_RAX;
  long *plVar3;
  undefined8 extraout_RAX_00;
  size_type *in_RCX;
  size_type *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_90;
  double local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  long local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  paVar1 = &(this->currency).field_2;
  (this->currency)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (currency->_M_dataplus)._M_p;
  local_70 = money;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + currency->_M_string_length);
  this->cents = 0;
  if (9.223372036854776e+18 < local_70 * 100.0) {
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_48,vsnprintf,0x148,"%f");
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x1040b0);
    paVar5 = &local_58;
    local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar3;
    in_RCX = (size_type *)(plVar3 + 2);
    if (local_68 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_RCX) {
      local_58._M_allocated_capacity = *in_RCX;
      local_58._8_8_ = plVar3[3];
      local_68 = paVar5;
      goto LAB_00102819;
    }
  }
  else {
    if (currency->_M_string_length == 3) {
      this->cents = (long)(local_70 * 100.0);
      return;
    }
    paVar5 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "Error in Money::Money() - Currency code must be provided according to ISO 4217.","")
    ;
    error(&local_90);
    plVar3 = extraout_RAX;
    local_68 = extraout_RDX;
  }
  local_58._M_allocated_capacity = *in_RCX;
LAB_00102819:
  local_60 = plVar3[1];
  *plVar3 = (long)in_RCX;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_90._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar4) {
    local_90.field_2._M_allocated_capacity = *psVar4;
    local_90.field_2._8_8_ = plVar3[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar4;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  error(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != paVar5) {
    operator_delete(local_68,local_58._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->currency)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

Money::Money(double money, const std::string& currency) : cents{ 0 }, currency{currency}
{
	if (!is_money_valid(money))
	{
		error("Error in Money::Money() - '" 
			+ std::to_string(money) + "' is not valid.");
	}
	if (currency.empty() || currency.size() != 3)
	{
		error("Error in Money::Money() - Currency code must be provided according to ISO 4217.");
	}
	cents = static_cast<long>(money * 100);
}